

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

void __thiscall slang::ast::DiagnosticVisitor::~DiagnosticVisitor(DiagnosticVisitor *this)

{
  boost::unordered::
  unordered_flat_map<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>_>_>_>
  ::~unordered_flat_map
            ((unordered_flat_map<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>_>_>_>
              *)0x613d0f);
  SmallVector<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>,_2UL>
  ::~SmallVector((SmallVector<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>,_2UL>
                  *)0x613d20);
  SmallVector<const_slang::ast::MethodPrototypeSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::MethodPrototypeSymbol_*,_5UL> *)0x613d31);
  SmallVector<const_slang::ast::SubroutineSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::SubroutineSymbol_*,_5UL> *)0x613d42);
  SmallVector<const_slang::ast::GenericClassDefSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::GenericClassDefSymbol_*,_5UL> *)0x613d53);
  boost::unordered::
  unordered_flat_set<const_slang::ast::DefinitionSymbol_*,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ::~unordered_flat_set
            ((unordered_flat_set<const_slang::ast::DefinitionSymbol_*,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
              *)0x613d61);
  boost::unordered::
  unordered_flat_set<const_slang::ast::InstanceBodySymbol_*,_slang::hash<const_slang::ast::InstanceBodySymbol_*,_void>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
  ::~unordered_flat_set
            ((unordered_flat_set<const_slang::ast::InstanceBodySymbol_*,_slang::hash<const_slang::ast::InstanceBodySymbol_*,_void>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
              *)0x613d6f);
  boost::unordered::
  unordered_flat_map<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry,_slang::hash<slang::ast::InstanceCacheKey,_void>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  ::~unordered_flat_map
            ((unordered_flat_map<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry,_slang::hash<slang::ast::InstanceCacheKey,_void>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
              *)0x613d7d);
  return;
}

Assistant:

DiagnosticVisitor(Compilation& compilation, const size_t& numErrors, uint32_t errorLimit) :
        compilation(compilation), numErrors(numErrors), errorLimit(errorLimit) {}